

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O0

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference input;
  long lVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *psVar7;
  char *pcVar8;
  ulong uVar9;
  cmTarget *this_00;
  byte local_662;
  cmTarget *target;
  undefined1 local_5d0 [6];
  bool escapeOldStyle;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  string msg_1;
  undefined1 local_510 [7];
  bool nameOk;
  undefined1 local_4f0 [8];
  ostringstream msg;
  size_type pos;
  string local_368;
  undefined1 local_348 [8];
  string dep;
  string filename;
  string *copy;
  uint j;
  uint start;
  undefined1 local_2f0 [3];
  bool excludeFromAll;
  tdoing doing;
  string job_pool;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  char *comment;
  string comment_buffer;
  string local_288 [5];
  bool command_expand_lists;
  bool uses_terminal;
  bool verbatim;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  cmCustomCommandLine currentLine;
  ostringstream local_1e8 [8];
  ostringstream e;
  string *targetName;
  allocator<char> local_51;
  string local_50;
  cmExecutionStatus *local_30;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddCustomTargetCommand *this_local;
  
  local_30 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"called with incorrect number of arguments",&local_51);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    this_local._7_1_ = 0;
  }
  else {
    input = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_3_local,0);
    lVar3 = std::__cxx11::string::find_first_of((char *)input,0x88a92a);
    if (lVar3 == -1) {
      cmCustomCommandLine::cmCustomCommandLine
                ((cmCustomCommandLine *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLines::cmCustomCommandLines
                ((cmCustomCommandLines *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&byproducts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&working_directory.field_2 + 8));
      std::__cxx11::string::string(local_288);
      comment_buffer.field_2._M_local_buf[0xf] = '\0';
      comment_buffer.field_2._M_local_buf[0xe] = '\0';
      comment_buffer.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string((string *)&comment);
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&job_pool.field_2 + 8));
      std::__cxx11::string::string((string *)local_2f0);
      start = 0;
      j._3_1_ = true;
      copy._4_4_ = 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_3_local);
      if (1 < sVar5) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,1);
        bVar2 = std::operator==(pvVar6,"ALL");
        if (bVar2) {
          copy._4_4_ = 2;
        }
        j._3_1_ = !bVar2;
      }
      for (copy._0_4_ = copy._4_4_;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_3_local), (uint)copy < sVar5; copy._0_4_ = (uint)copy + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,(ulong)(uint)copy);
        bVar2 = std::operator==(pvVar6,"DEPENDS");
        if (bVar2) {
          start = 1;
        }
        else {
          bVar2 = std::operator==(pvVar6,"BYPRODUCTS");
          if (bVar2) {
            start = 2;
          }
          else {
            bVar2 = std::operator==(pvVar6,"WORKING_DIRECTORY");
            if (bVar2) {
              start = 3;
            }
            else {
              bVar2 = std::operator==(pvVar6,"VERBATIM");
              if (bVar2) {
                start = 7;
                comment_buffer.field_2._M_local_buf[0xf] = '\x01';
              }
              else {
                bVar2 = std::operator==(pvVar6,"USES_TERMINAL");
                if (bVar2) {
                  start = 7;
                  comment_buffer.field_2._M_local_buf[0xe] = '\x01';
                }
                else {
                  bVar2 = std::operator==(pvVar6,"COMMAND_EXPAND_LISTS");
                  if (bVar2) {
                    start = 7;
                    comment_buffer.field_2._M_local_buf[0xd] = '\x01';
                  }
                  else {
                    bVar2 = std::operator==(pvVar6,"COMMENT");
                    if (bVar2) {
                      start = 4;
                    }
                    else {
                      bVar2 = std::operator==(pvVar6,"JOB_POOL");
                      if (bVar2) {
                        start = 6;
                      }
                      else {
                        bVar2 = std::operator==(pvVar6,"COMMAND");
                        if (bVar2) {
                          start = 0;
                          bVar2 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&commandLines.
                                              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                              .
                                              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          if (!bVar2) {
                            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                            push_back((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       *)&depends.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (value_type *)
                                      &commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       .
                                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&commandLines.
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          }
                        }
                        else {
                          bVar2 = std::operator==(pvVar6,"SOURCES");
                          if (bVar2) {
                            start = 5;
                          }
                          else {
                            switch(start) {
                            case 0:
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&commandLines.
                                              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                              .
                                              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          pvVar6);
                              break;
                            case 1:
                              std::__cxx11::string::string((string *)local_348,(string *)pvVar6);
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_348);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&byproducts.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (value_type *)local_348);
                              std::__cxx11::string::~string((string *)local_348);
                              break;
                            case 2:
                              std::__cxx11::string::string((string *)(dep.field_2._M_local_buf + 8))
                              ;
                              bVar2 = cmsys::SystemTools::FileIsFullPath(pvVar6);
                              if (!bVar2) {
                                psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                                                   ((this->super_cmCommand).Makefile);
                                std::__cxx11::string::operator=
                                          ((string *)(dep.field_2._M_local_buf + 8),(string *)psVar7
                                          );
                                std::__cxx11::string::operator+=
                                          ((string *)(dep.field_2._M_local_buf + 8),"/");
                              }
                              std::__cxx11::string::operator+=
                                        ((string *)(dep.field_2._M_local_buf + 8),(string *)pvVar6);
                              cmsys::SystemTools::ConvertToUnixSlashes
                                        ((string *)((long)&dep.field_2 + 8));
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)((long)&working_directory.field_2 + 8),
                                          (value_type *)((long)&dep.field_2 + 8));
                              std::__cxx11::string::~string
                                        ((string *)(dep.field_2._M_local_buf + 8));
                              break;
                            case 3:
                              std::__cxx11::string::operator=(local_288,(string *)pvVar6);
                              break;
                            case 4:
                              std::__cxx11::string::operator=((string *)&comment,(string *)pvVar6);
                              sources.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                   (pointer)std::__cxx11::string::c_str();
                              break;
                            case 5:
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)((long)&job_pool.field_2 + 8),pvVar6);
                              break;
                            case 6:
                              std::__cxx11::string::operator=((string *)local_2f0,(string *)pvVar6);
                              break;
                            default:
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_368,
                                         "Wrong syntax. Unknown type of argument.",
                                         (allocator<char> *)((long)&pos + 7));
                              cmCommand::SetError(&this->super_cmCommand,&local_368);
                              std::__cxx11::string::~string((string *)&local_368);
                              std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                              this_local._7_1_ = 0;
                              pos._0_4_ = 1;
                              goto LAB_002af607;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      lVar3 = std::__cxx11::string::find_first_of((char *)input,0x885459);
      if (lVar3 == -1) {
        bVar2 = cmGeneratorExpression::IsValidTargetName(input);
        local_662 = 0;
        if (bVar2) {
          bVar2 = cmGlobalGenerator::IsReservedTarget(input);
          local_662 = bVar2 ^ 0xff;
        }
        msg_1.field_2._M_local_buf[0xf] = local_662 & 1;
        if (msg_1.field_2._M_local_buf[0xf] != 0) {
          lVar3 = std::__cxx11::string::find((char)input,0x3a);
          msg_1.field_2._M_local_buf[0xf] = lVar3 == -1;
        }
        if ((msg_1.field_2._M_local_buf[0xf] != '\0') ||
           (bVar2 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,input,UTILITY), bVar2)
           ) {
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&commandLines.
                              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              .
                              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar2) {
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                      ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type *)
                       &commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::__cxx11::string::string((string *)local_538);
          bVar2 = cmMakefile::EnforceUniqueName
                            ((this->super_cmCommand).Makefile,input,(string *)local_538,true);
          if (!bVar2) {
            cmCommand::SetError(&this->super_cmCommand,(string *)local_538);
            this_local._7_1_ = 0;
          }
          pos._0_4_ = (uint)!bVar2;
          std::__cxx11::string::~string((string *)local_538);
          if ((uint)pos == 0) {
            bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                               &depends.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((!bVar2) ||
               (bVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&working_directory.field_2 + 8)), bVar2)) {
              bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  *)&depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xe] & 1U) != 0)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_580,
                           "USES_TERMINAL may not be specified without any COMMAND",&local_581);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_580);
                std::__cxx11::string::~string((string *)&local_580);
                std::allocator<char>::~allocator(&local_581);
                this_local._7_1_ = 1;
                pos._0_4_ = 1;
              }
              else {
                bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                        empty((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                              &depends.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xd] & 1U) != 0)) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_5a8,
                             "COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                             &local_5a9);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_5a8);
                  std::__cxx11::string::~string((string *)&local_5a8);
                  std::allocator<char>::~allocator(&local_5a9);
                  this_local._7_1_ = 1;
                  pos._0_4_ = 1;
                }
                else if (((comment_buffer.field_2._M_local_buf[0xe] & 1U) == 0) ||
                        (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
                  target._6_1_ = ~comment_buffer.field_2._M_local_buf[0xf] & 1;
                  pcVar1 = (this->super_cmCommand).Makefile;
                  pcVar8 = (char *)std::__cxx11::string::c_str();
                  this_00 = cmMakefile::AddUtilityCommand
                                      (pcVar1,input,Project,j._3_1_,pcVar8,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&working_directory.field_2 + 8),
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&byproducts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (cmCustomCommandLines *)
                                       &depends.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (bool)(target._6_1_ & 1),
                                       (char *)sources.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (bool)(comment_buffer.field_2._M_local_buf[0xe] & 1),
                                       (bool)(comment_buffer.field_2._M_local_buf[0xd] & 1),
                                       (string *)local_2f0);
                  cmTarget::AddSources
                            (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&job_pool.field_2 + 8));
                  this_local._7_1_ = 1;
                  pos._0_4_ = 1;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_5d0,"JOB_POOL is shadowed by USES_TERMINAL.",
                             (allocator<char> *)((long)&target + 7));
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_5d0);
                  std::__cxx11::string::~string((string *)local_5d0);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
                  this_local._7_1_ = 0;
                  pos._0_4_ = 1;
                }
              }
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_558,"BYPRODUCTS may not be specified without any COMMAND",
                         &local_559);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_558);
              std::__cxx11::string::~string((string *)&local_558);
              std::allocator<char>::~allocator(&local_559);
              this_local._7_1_ = 1;
              pos._0_4_ = 1;
            }
          }
        }
        else {
          this_local._7_1_ = 0;
          pos._0_4_ = 1;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
        poVar4 = std::operator<<((ostream *)local_4f0,"called with target name containing a \"");
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)input);
        poVar4 = std::operator<<(poVar4,*pcVar8);
        std::operator<<(poVar4,"\".  This character is not allowed.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_510);
        std::__cxx11::string::~string((string *)local_510);
        this_local._7_1_ = 0;
        pos._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
      }
LAB_002af607:
      std::__cxx11::string::~string((string *)local_2f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&job_pool.field_2 + 8));
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string(local_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&working_directory.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&byproducts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLines::~cmCustomCommandLines
                ((cmCustomCommandLines *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLine::~cmCustomCommandLine
                ((cmCustomCommandLine *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar4 = std::operator<<((ostream *)local_1e8,"called with invalid target name \"");
      poVar4 = std::operator<<(poVar4,(string *)input);
      poVar4 = std::operator<<(poVar4,"\".  Target names may not contain a slash.  ");
      std::operator<<(poVar4,"Use ADD_CUSTOM_COMMAND to generate files.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,
                          (string *)
                          &currentLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddCustomTargetCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy)) {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(targetName, msg, true)) {
      this->SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    this->SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target = this->Makefile->AddUtilityCommand(
    targetName, cmMakefile::TargetOrigin::Project, excludeFromAll,
    working_directory.c_str(), byproducts, depends, commandLines,
    escapeOldStyle, comment, uses_terminal, command_expand_lists, job_pool);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}